

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfHeader.c
# Opt level: O0

_Bool queueHeader(arguments *args,queue *out)

{
  SkeinSize_t SVar1;
  _Bool _Var2;
  uint16_t version;
  chunk *chunk;
  uint64_t *puVar3;
  chunk *header;
  uint64_t block_byte_size;
  uint16_t header_ver;
  _Bool success;
  queue *out_local;
  arguments *args_local;
  
  if (args->iv == (uint64_t *)0x0) {
    args_local._7_1_ = false;
  }
  else {
    args_local._7_1_ = false;
    version = 2;
    if (((byte)args->field_0x3c >> 4 & 1) == 1) {
      version = 1;
    }
    SVar1 = args->state_size;
    chunk = createChunk();
    chunk->action = '\x01';
    puVar3 = genHeader(args->iv,args->file_size,args->state_size,version);
    chunk->data = puVar3;
    chunk->data_size = (ulong)(SVar1 >> 3) << 1;
    if (chunk->data != (uint64_t *)0x0) {
      do {
        _Var2 = enque(chunk,out);
      } while (!_Var2);
      args_local._7_1_ = true;
    }
    if (args->iv != (uint64_t *)0x0) {
      free(args->iv);
      args->iv = (uint64_t *)0x0;
    }
  }
  return args_local._7_1_;
}

Assistant:

bool queueHeader(arguments* args, queue* out)
{
    pdebug("queueHeader()\n");
    
    if(args->iv == NULL) { return false; } //iv doesn't exist we can't continue

    bool success = false;
    uint16_t header_ver = (args->legacy_hash==true) ? 1 : 2; 
    const uint64_t block_byte_size = ((uint64_t)args->state_size/8);

    chunk* header = createChunk();
    header->action = ENCRYPT;
    header->data = genHeader(args->iv, args->file_size, args->state_size, header_ver);
    header->data_size = 2*block_byte_size;

    if(header->data != NULL) //check that allocate succeeded
    {
        while(enque(header, out) != true); //spin until the header has been queued
        success = true;
    }

    if(args->iv != NULL) //free the iv
    { 
        free(args->iv);
        args->iv = NULL;
    } 

    return success;
}